

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManCSPassiveClauseContainer.cpp
# Opt level: O3

int __thiscall
Saturation::ManCSPassiveClauseContainer::remove(ManCSPassiveClauseContainer *this,char *__filename)

{
  Clause **__src;
  HandlerList *pHVar1;
  int iVar2;
  __normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
  __dest;
  Clause **ppCVar3;
  
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<Kernel::Clause**,std::vector<Kernel::Clause*,std::allocator<Kernel::Clause*>>>,__gnu_cxx::__ops::_Iter_equals_val<Kernel::Clause*const>>
                     ((this->clauses).
                      super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (this->clauses).
                      super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  __src = __dest._M_current + 1;
  ppCVar3 = (this->clauses).super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (__src != ppCVar3) {
    __dest._M_current = (Clause **)memmove(__dest._M_current,__src,(long)ppCVar3 - (long)__src);
    ppCVar3 = (this->clauses).
              super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  iVar2 = (int)__dest._M_current;
  (this->clauses).super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppCVar3 + -1;
  for (pHVar1 = (this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.
                super_ClauseContainer.removedEvent.super_BaseEvent._handlers;
      pHVar1 != (HandlerList *)0x0; pHVar1 = pHVar1->_tail) {
    iVar2 = (*pHVar1->_head->_vptr_HandlerStruct[2])(pHVar1->_head,__filename);
  }
  return iVar2;
}

Assistant:

void ManCSPassiveClauseContainer::remove(Clause* cl)
{
  ASS(cl->store()==Clause::PASSIVE);

  auto it = std::find(clauses.begin(),clauses.end(),cl);
  ASS(it != clauses.end());
  clauses.erase(it);

  removedEvent.fire(cl);
  ASS(cl->store()!=Clause::PASSIVE);
}